

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * QtTimeZoneLocale::zoneOffsetFormat
                    (QLocale *locale,qsizetype param_2,FormatType width,QDateTime *when,
                    int offsetSeconds)

{
  bool bVar1;
  undefined4 in_ECX;
  QLocale *in_RSI;
  QString *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QString *text;
  QString *in_stack_ffffffffffffff68;
  QString *this;
  uint3 in_stack_ffffffffffffff98;
  uint uVar2;
  int offsetSeconds_00;
  undefined4 in_stack_ffffffffffffffa8;
  QString *this_00;
  QDateTime *in_stack_ffffffffffffffc8;
  QTimeZone *in_stack_ffffffffffffffd0;
  char local_10 [8];
  long local_8;
  
  offsetSeconds_00 = (int)((ulong)in_R8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)in_stack_ffffffffffffff98;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  this_00 = in_RDI;
  QLocale::system(local_10);
  bVar1 = ::operator!=((QLocale *)this,(QLocale *)in_stack_ffffffffffffff68);
  if (bVar1) {
    QDateTime::timeRepresentation((QDateTime *)in_stack_ffffffffffffff68);
    QTimeZone::displayName
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (NameType)((ulong)this_00 >> 0x20),in_RSI);
    QTimeZone::~QTimeZone((QTimeZone *)0x4d3f88);
  }
  else {
    QDateTime::toOffsetFromUtc
              ((QDateTime *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8),offsetSeconds_00);
    QDateTime::timeZoneAbbreviation((QDateTime *)this_00);
    QDateTime::~QDateTime((QDateTime *)0x4d3f72);
  }
  QLocale::~QLocale((QLocale *)0x4d3f95);
  bVar1 = QString::isEmpty((QString *)0x4d3f9f);
  if (!bVar1) {
    offsetFromAbbreviation((QString *)CONCAT44(in_R9D,uVar2));
    QString::operator=(this,in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x4d3fd1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString zoneOffsetFormat([[maybe_unused]] const QLocale &locale,
                         qsizetype,
                         [[maybe_unused]] QLocale::FormatType width,
                         const QDateTime &when,
                         int offsetSeconds)
{
    // Only the non-ICU TZ-locale code uses the other two widths:
    Q_ASSERT(width == QLocale::ShortFormat); //
    QString text =
#if QT_CONFIG(timezone)
        locale != QLocale::system()
        ? when.timeRepresentation().displayName(when, QTimeZone::OffsetName, locale)
        :
#endif
        when.toOffsetFromUtc(offsetSeconds).timeZoneAbbreviation();

    if (!text.isEmpty())
        text = offsetFromAbbreviation(std::move(text));
    // else: no suitable representation of the zone.
    return text;
}